

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O1

void ihevc_itrans_32x32(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                       WORD32 i4_shift,WORD32 zero_cols)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  WORD32 ee [8];
  WORD32 eo [8];
  WORD32 e [16];
  WORD32 o [16];
  int local_f8 [7];
  int iStack_dc;
  int aiStack_d8 [8];
  int aiStack_b8 [16];
  int aiStack_78 [18];
  
  iVar5 = 1 << ((char)i4_shift - 1U & 0x1f);
  auVar33 = pmovsxwd(in_XMM2,0x120032004b0059);
  auVar34 = pmovsxwd(auVar33,0xffceffa7ffee004b);
  auVar35 = pmovsxwd(auVar34,0x4b0012ffa70032);
  auVar36 = pmovsxwd(auVar35,0xffa7004bffce0012);
  auVar40 = pmovzxdq(in_XMM3,ZEXT416((uint)i4_shift));
  iVar24 = 0;
  do {
    if ((zero_cols & 1U) == 0) {
      iVar6 = (int)pi2_src[src_strd];
      uVar7 = (uint)pi2_src[src_strd * 3];
      auVar55 = ZEXT416(uVar7);
      uVar8 = (uint)pi2_src[src_strd * 5];
      auVar60 = ZEXT416(uVar8);
      iVar9 = (int)pi2_src[src_strd * 7];
      iVar10 = (int)pi2_src[src_strd * 9];
      iVar11 = (int)pi2_src[src_strd * 0xb];
      iVar12 = (int)pi2_src[src_strd * 0xd];
      iVar13 = (int)pi2_src[src_strd * 0xf];
      iVar14 = (int)pi2_src[src_strd * 0x11];
      iVar15 = (int)pi2_src[src_strd * 0x13];
      iVar16 = (int)pi2_src[src_strd * 0x15];
      iVar17 = (int)pi2_src[src_strd * 0x17];
      iVar18 = (int)pi2_src[src_strd * 0x19];
      iVar19 = (int)pi2_src[src_strd * 0x1b];
      iVar20 = (int)pi2_src[src_strd * 0x1d];
      iVar21 = (int)pi2_src[src_strd * 0x1f];
      auVar49._4_4_ = uVar8;
      auVar49._0_4_ = uVar8;
      auVar49._8_4_ = uVar8;
      auVar49._12_4_ = uVar8;
      auVar66._4_4_ = iVar9;
      auVar66._0_4_ = iVar9;
      auVar66._8_4_ = iVar9;
      auVar66._12_4_ = iVar9;
      auVar67._4_4_ = iVar10;
      auVar67._0_4_ = iVar10;
      auVar67._8_4_ = iVar10;
      auVar67._12_4_ = iVar10;
      auVar68._4_4_ = iVar11;
      auVar68._0_4_ = iVar11;
      auVar68._8_4_ = iVar11;
      auVar68._12_4_ = iVar11;
      auVar69._4_4_ = iVar13;
      auVar69._0_4_ = iVar13;
      auVar69._8_4_ = iVar13;
      auVar69._12_4_ = iVar13;
      auVar70._4_4_ = iVar14;
      auVar70._0_4_ = iVar14;
      auVar70._8_4_ = iVar14;
      auVar70._12_4_ = iVar14;
      auVar63._4_4_ = iVar15;
      auVar63._0_4_ = iVar15;
      auVar63._8_4_ = iVar15;
      auVar63._12_4_ = iVar15;
      auVar32._4_4_ = iVar16;
      auVar32._0_4_ = iVar16;
      auVar32._8_4_ = iVar16;
      auVar32._12_4_ = iVar16;
      auVar39._4_4_ = iVar17;
      auVar39._0_4_ = iVar17;
      auVar39._8_4_ = iVar17;
      auVar39._12_4_ = iVar17;
      auVar41._4_4_ = iVar18;
      auVar41._0_4_ = iVar18;
      auVar41._8_4_ = iVar18;
      auVar41._12_4_ = iVar18;
      auVar47._4_4_ = iVar19;
      auVar47._0_4_ = iVar19;
      auVar47._8_4_ = iVar19;
      auVar47._12_4_ = iVar19;
      auVar43._4_4_ = iVar20;
      auVar43._0_4_ = iVar20;
      auVar43._8_4_ = iVar20;
      auVar43._12_4_ = iVar20;
      auVar45._4_4_ = iVar21;
      auVar45._0_4_ = iVar21;
      auVar45._8_4_ = iVar21;
      auVar45._12_4_ = iVar21;
      lVar22 = 0;
      auVar50 = auVar49;
      do {
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[1] + lVar22));
        auVar4._4_4_ = iVar6;
        auVar4._0_4_ = iVar6;
        auVar4._8_4_ = iVar6;
        auVar4._12_4_ = iVar6;
        auVar50 = pmulld(auVar50,auVar4);
        auVar55 = pmovsxwd(auVar55,*(undefined8 *)(g_ai2_ihevc_trans_32[3] + lVar22));
        auVar3._4_4_ = uVar7;
        auVar3._0_4_ = uVar7;
        auVar3._8_4_ = uVar7;
        auVar3._12_4_ = uVar7;
        auVar55 = pmulld(auVar55,auVar3);
        auVar56._0_4_ = auVar55._0_4_ + auVar50._0_4_;
        auVar56._4_4_ = auVar55._4_4_ + auVar50._4_4_;
        auVar56._8_4_ = auVar55._8_4_ + auVar50._8_4_;
        auVar56._12_4_ = auVar55._12_4_ + auVar50._12_4_;
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[5] + lVar22));
        auVar50 = pmulld(auVar50,auVar49);
        auVar55 = pmovsxwd(auVar60,*(undefined8 *)(g_ai2_ihevc_trans_32[7] + lVar22));
        auVar55 = pmulld(auVar55,auVar66);
        auVar61._0_4_ = auVar55._0_4_ + auVar50._0_4_ + auVar56._0_4_;
        auVar61._4_4_ = auVar55._4_4_ + auVar50._4_4_ + auVar56._4_4_;
        auVar61._8_4_ = auVar55._8_4_ + auVar50._8_4_ + auVar56._8_4_;
        auVar61._12_4_ = auVar55._12_4_ + auVar50._12_4_ + auVar56._12_4_;
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[9] + lVar22));
        auVar50 = pmulld(auVar50,auVar67);
        auVar55 = pmovsxwd(auVar56,*(undefined8 *)(g_ai2_ihevc_trans_32[0xb] + lVar22));
        auVar55 = pmulld(auVar55,auVar68);
        auVar57._0_4_ = auVar55._0_4_ + auVar50._0_4_;
        auVar57._4_4_ = auVar55._4_4_ + auVar50._4_4_;
        auVar57._8_4_ = auVar55._8_4_ + auVar50._8_4_;
        auVar57._12_4_ = auVar55._12_4_ + auVar50._12_4_;
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[0xd] + lVar22));
        auVar53._4_4_ = iVar12;
        auVar53._0_4_ = iVar12;
        auVar53._8_4_ = iVar12;
        auVar53._12_4_ = iVar12;
        auVar50 = pmulld(auVar50,auVar53);
        auVar51._0_4_ = auVar50._0_4_ + auVar57._0_4_ + auVar61._0_4_;
        auVar51._4_4_ = auVar50._4_4_ + auVar57._4_4_ + auVar61._4_4_;
        auVar51._8_4_ = auVar50._8_4_ + auVar57._8_4_ + auVar61._8_4_;
        auVar51._12_4_ = auVar50._12_4_ + auVar57._12_4_ + auVar61._12_4_;
        auVar50 = pmovsxwd(auVar57,*(undefined8 *)(g_ai2_ihevc_trans_32[0xf] + lVar22));
        auVar50 = pmulld(auVar50,auVar69);
        auVar55 = pmovsxwd(auVar61,*(undefined8 *)(g_ai2_ihevc_trans_32[0x11] + lVar22));
        auVar55 = pmulld(auVar55,auVar70);
        auVar62._0_4_ = auVar55._0_4_ + auVar50._0_4_;
        auVar62._4_4_ = auVar55._4_4_ + auVar50._4_4_;
        auVar62._8_4_ = auVar55._8_4_ + auVar50._8_4_;
        auVar62._12_4_ = auVar55._12_4_ + auVar50._12_4_;
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[0x13] + lVar22));
        auVar50 = pmulld(auVar50,auVar63);
        auVar58._0_4_ = auVar50._0_4_ + auVar62._0_4_;
        auVar58._4_4_ = auVar50._4_4_ + auVar62._4_4_;
        auVar58._8_4_ = auVar50._8_4_ + auVar62._8_4_;
        auVar58._12_4_ = auVar50._12_4_ + auVar62._12_4_;
        auVar50 = pmovsxwd(auVar62,*(undefined8 *)(g_ai2_ihevc_trans_32[0x15] + lVar22));
        auVar50 = pmulld(auVar50,auVar32);
        auVar60._0_4_ = auVar50._0_4_ + auVar58._0_4_ + auVar51._0_4_;
        auVar60._4_4_ = auVar50._4_4_ + auVar58._4_4_ + auVar51._4_4_;
        auVar60._8_4_ = auVar50._8_4_ + auVar58._8_4_ + auVar51._8_4_;
        auVar60._12_4_ = auVar50._12_4_ + auVar58._12_4_ + auVar51._12_4_;
        auVar50 = pmovsxwd(auVar51,*(undefined8 *)(g_ai2_ihevc_trans_32[0x17] + lVar22));
        auVar50 = pmulld(auVar50,auVar39);
        auVar55 = pmovsxwd(auVar58,*(undefined8 *)(g_ai2_ihevc_trans_32[0x19] + lVar22));
        auVar55 = pmulld(auVar55,auVar41);
        auVar59._0_4_ = auVar55._0_4_ + auVar50._0_4_;
        auVar59._4_4_ = auVar55._4_4_ + auVar50._4_4_;
        auVar59._8_4_ = auVar55._8_4_ + auVar50._8_4_;
        auVar59._12_4_ = auVar55._12_4_ + auVar50._12_4_;
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[0x1b] + lVar22));
        auVar50 = pmulld(auVar50,auVar47);
        auVar52._0_4_ = auVar50._0_4_ + auVar59._0_4_;
        auVar52._4_4_ = auVar50._4_4_ + auVar59._4_4_;
        auVar52._8_4_ = auVar50._8_4_ + auVar59._8_4_;
        auVar52._12_4_ = auVar50._12_4_ + auVar59._12_4_;
        auVar50 = pmovsxwd(auVar59,*(undefined8 *)(g_ai2_ihevc_trans_32[0x1d] + lVar22));
        auVar50 = pmulld(auVar50,auVar43);
        auVar55._0_4_ = auVar50._0_4_ + auVar52._0_4_;
        auVar55._4_4_ = auVar50._4_4_ + auVar52._4_4_;
        auVar55._8_4_ = auVar50._8_4_ + auVar52._8_4_;
        auVar55._12_4_ = auVar50._12_4_ + auVar52._12_4_;
        auVar50 = pmovsxwd(auVar52,*(undefined8 *)(g_ai2_ihevc_trans_32[0x1f] + lVar22));
        auVar53 = pmulld(auVar50,auVar45);
        auVar50._0_4_ = auVar53._0_4_ + auVar55._0_4_ + auVar60._0_4_;
        auVar50._4_4_ = auVar53._4_4_ + auVar55._4_4_ + auVar60._4_4_;
        auVar50._8_4_ = auVar53._8_4_ + auVar55._8_4_ + auVar60._8_4_;
        auVar50._12_4_ = auVar53._12_4_ + auVar55._12_4_ + auVar60._12_4_;
        *(undefined1 (*) [16])(aiStack_78 + lVar22) = auVar50;
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x10);
      iVar6 = (int)pi2_src[src_strd * 2];
      iVar9 = (int)pi2_src[src_strd * 6];
      iVar10 = (int)pi2_src[src_strd * 10];
      iVar11 = (int)pi2_src[src_strd * 0xe];
      iVar12 = (int)pi2_src[src_strd * 0x12];
      iVar13 = (int)pi2_src[src_strd * 0x16];
      iVar14 = (int)pi2_src[src_strd * 0x1a];
      iVar15 = (int)pi2_src[src_strd * 0x1e];
      auVar25._4_4_ = iVar6;
      auVar25._0_4_ = iVar6;
      auVar25._8_4_ = iVar6;
      auVar25._12_4_ = iVar6;
      auVar30._4_4_ = iVar9;
      auVar30._0_4_ = iVar9;
      auVar30._8_4_ = iVar9;
      auVar30._12_4_ = iVar9;
      auVar37._4_4_ = iVar10;
      auVar37._0_4_ = iVar10;
      auVar37._8_4_ = iVar10;
      auVar37._12_4_ = iVar10;
      auVar42._4_4_ = iVar11;
      auVar42._0_4_ = iVar11;
      auVar42._8_4_ = iVar11;
      auVar42._12_4_ = iVar11;
      auVar44._4_4_ = iVar12;
      auVar44._0_4_ = iVar12;
      auVar44._8_4_ = iVar12;
      auVar44._12_4_ = iVar12;
      auVar46._4_4_ = iVar13;
      auVar46._0_4_ = iVar13;
      auVar46._8_4_ = iVar13;
      auVar46._12_4_ = iVar13;
      auVar48._4_4_ = iVar14;
      auVar48._0_4_ = iVar14;
      auVar48._8_4_ = iVar14;
      auVar48._12_4_ = iVar14;
      auVar54._4_4_ = iVar15;
      auVar54._0_4_ = iVar15;
      auVar54._8_4_ = iVar15;
      auVar54._12_4_ = iVar15;
      lVar22 = 0;
      do {
        auVar50 = pmovsxwd(auVar55,*(undefined8 *)(g_ai2_ihevc_trans_32[2] + lVar22));
        auVar50 = pmulld(auVar50,auVar25);
        auVar63 = pmovsxwd(auVar60,*(undefined8 *)(g_ai2_ihevc_trans_32[6] + lVar22));
        auVar63 = pmulld(auVar63,auVar30);
        auVar64._0_4_ = auVar63._0_4_ + auVar50._0_4_;
        auVar64._4_4_ = auVar63._4_4_ + auVar50._4_4_;
        auVar64._8_4_ = auVar63._8_4_ + auVar50._8_4_;
        auVar64._12_4_ = auVar63._12_4_ + auVar50._12_4_;
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[10] + lVar22));
        auVar50 = pmulld(auVar50,auVar37);
        auVar63 = pmovsxwd(auVar66,*(undefined8 *)(g_ai2_ihevc_trans_32[0xe] + lVar22));
        auVar63 = pmulld(auVar63,auVar42);
        auVar66._0_4_ = auVar63._0_4_ + auVar50._0_4_ + auVar64._0_4_;
        auVar66._4_4_ = auVar63._4_4_ + auVar50._4_4_ + auVar64._4_4_;
        auVar66._8_4_ = auVar63._8_4_ + auVar50._8_4_ + auVar64._8_4_;
        auVar66._12_4_ = auVar63._12_4_ + auVar50._12_4_ + auVar64._12_4_;
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[0x12] + lVar22));
        auVar50 = pmulld(auVar50,auVar44);
        auVar63 = pmovsxwd(auVar64,*(undefined8 *)(g_ai2_ihevc_trans_32[0x16] + lVar22));
        auVar63 = pmulld(auVar63,auVar46);
        auVar65._0_4_ = auVar63._0_4_ + auVar50._0_4_;
        auVar65._4_4_ = auVar63._4_4_ + auVar50._4_4_;
        auVar65._8_4_ = auVar63._8_4_ + auVar50._8_4_;
        auVar65._12_4_ = auVar63._12_4_ + auVar50._12_4_;
        auVar50 = pmovsxwd(auVar50,*(undefined8 *)(g_ai2_ihevc_trans_32[0x1a] + lVar22));
        auVar50 = pmulld(auVar50,auVar48);
        auVar55._0_4_ = auVar50._0_4_ + auVar65._0_4_ + auVar66._0_4_;
        auVar55._4_4_ = auVar50._4_4_ + auVar65._4_4_ + auVar66._4_4_;
        auVar55._8_4_ = auVar50._8_4_ + auVar65._8_4_ + auVar66._8_4_;
        auVar55._12_4_ = auVar50._12_4_ + auVar65._12_4_ + auVar66._12_4_;
        auVar50 = pmovsxwd(auVar65,*(undefined8 *)(g_ai2_ihevc_trans_32[0x1e] + lVar22));
        auVar50 = pmulld(auVar50,auVar54);
        auVar60._0_4_ = auVar50._0_4_ + auVar55._0_4_;
        auVar60._4_4_ = auVar50._4_4_ + auVar55._4_4_;
        auVar60._8_4_ = auVar50._8_4_ + auVar55._8_4_;
        auVar60._12_4_ = auVar50._12_4_ + auVar55._12_4_;
        *(undefined1 (*) [16])(aiStack_d8 + lVar22) = auVar60;
        lVar22 = lVar22 + 4;
      } while (lVar22 != 8);
      iVar12 = (int)pi2_src[src_strd * 0x1c];
      iVar16 = (int)pi2_src[src_strd * 0x14];
      iVar14 = (int)pi2_src[src_strd * 0xc];
      iVar10 = (int)pi2_src[src_strd * 4];
      iVar9 = pi2_src[src_strd * 0x18] * 0x24 + pi2_src[src_strd * 8] * 0x53;
      iVar11 = pi2_src[src_strd * 0x18] * -0x53 + pi2_src[src_strd * 8] * 0x24;
      iVar13 = pi2_src[src_strd * 0x10] * 0x40 + *pi2_src * 0x40;
      iVar15 = pi2_src[src_strd * 0x10] * -0x40 + *pi2_src * 0x40;
      iVar6 = iVar13 + iVar9;
      iVar13 = iVar13 - iVar9;
      iVar9 = iVar15 + iVar11;
      iVar15 = iVar15 - iVar11;
      auVar26._4_4_ = iVar10;
      auVar26._0_4_ = iVar10;
      auVar26._8_4_ = iVar10;
      auVar26._12_4_ = iVar10;
      auVar50 = pmulld(auVar26,auVar33);
      auVar31._4_4_ = iVar14;
      auVar31._0_4_ = iVar14;
      auVar31._8_4_ = iVar14;
      auVar31._12_4_ = iVar14;
      auVar32 = pmulld(auVar31,auVar34);
      auVar27._4_4_ = iVar16;
      auVar27._0_4_ = iVar16;
      auVar27._8_4_ = iVar16;
      auVar27._12_4_ = iVar16;
      auVar63 = pmulld(auVar27,auVar35);
      auVar38._4_4_ = iVar12;
      auVar38._0_4_ = iVar12;
      auVar38._8_4_ = iVar12;
      auVar38._12_4_ = iVar12;
      auVar39 = pmulld(auVar38,auVar36);
      iVar10 = auVar39._0_4_ + auVar63._0_4_ + auVar32._0_4_ + auVar50._0_4_;
      iVar11 = auVar39._4_4_ + auVar63._4_4_ + auVar32._4_4_ + auVar50._4_4_;
      iVar12 = auVar39._8_4_ + auVar63._8_4_ + auVar32._8_4_ + auVar50._8_4_;
      iVar14 = auVar39._12_4_ + auVar63._12_4_ + auVar32._12_4_ + auVar50._12_4_;
      local_f8[0] = iVar10 + iVar6;
      local_f8[1] = iVar11 + iVar9;
      local_f8[2] = iVar12 + iVar15;
      local_f8[3] = iVar14 + iVar13;
      local_f8[4] = iVar13 - iVar14;
      local_f8[5] = iVar15 - iVar12;
      local_f8[6] = iVar9 - iVar11;
      iStack_dc = iVar6 - iVar10;
      lVar22 = 0x10;
      lVar23 = 0;
      do {
        iVar6 = *(int *)((long)aiStack_d8 + lVar23 + 4);
        iVar9 = *(int *)((long)aiStack_d8 + lVar23 + 8);
        iVar10 = *(int *)((long)aiStack_d8 + lVar23 + 0xc);
        iVar11 = *(int *)((long)local_f8 + lVar23 + 4);
        iVar12 = *(int *)((long)local_f8 + lVar23 + 8);
        iVar13 = *(int *)((long)local_f8 + lVar23 + 0xc);
        *(int *)((long)aiStack_b8 + lVar23) =
             *(int *)((long)aiStack_d8 + lVar23) + *(int *)((long)local_f8 + lVar23);
        *(int *)((long)aiStack_b8 + lVar23 + 4) = iVar6 + iVar11;
        *(int *)((long)aiStack_b8 + lVar23 + 8) = iVar9 + iVar12;
        *(int *)((long)aiStack_b8 + lVar23 + 0xc) = iVar10 + iVar13;
        iVar6 = *(int *)((long)local_f8 + lVar22);
        iVar9 = *(int *)((long)local_f8 + lVar22 + 4);
        iVar10 = *(int *)((long)local_f8 + lVar22 + 8);
        iVar11 = *(int *)((long)aiStack_d8 + lVar22);
        iVar12 = *(int *)((long)aiStack_d8 + lVar22 + 4);
        iVar13 = *(int *)((long)aiStack_d8 + lVar22 + 8);
        *(int *)((long)aiStack_b8 + lVar23 + 0x20) =
             *(int *)((long)local_f8 + lVar22 + 0xc) - *(int *)((long)aiStack_d8 + lVar22 + 0xc);
        *(int *)((long)aiStack_b8 + lVar23 + 0x24) = iVar10 - iVar13;
        *(int *)((long)aiStack_b8 + lVar23 + 0x28) = iVar9 - iVar12;
        *(int *)((long)aiStack_b8 + lVar23 + 0x2c) = iVar6 - iVar11;
        lVar23 = lVar23 + 0x10;
        lVar22 = lVar22 + -0x10;
      } while (lVar23 != 0x20);
      lVar22 = 0x30;
      lVar23 = 0;
      do {
        lVar1 = lVar23 * 2;
        lVar2 = lVar23 * 2;
        auVar28._0_4_ =
             *(int *)((long)aiStack_b8 + lVar1) + iVar5 + *(int *)((long)aiStack_78 + lVar2) >>
             auVar40;
        auVar28._4_4_ =
             *(int *)((long)aiStack_b8 + lVar1 + 4) + iVar5 + *(int *)((long)aiStack_78 + lVar2 + 4)
             >> auVar40;
        auVar28._8_4_ =
             *(int *)((long)aiStack_b8 + lVar1 + 8) + iVar5 + *(int *)((long)aiStack_78 + lVar2 + 8)
             >> auVar40;
        auVar28._12_4_ =
             *(int *)((long)aiStack_b8 + lVar1 + 0xc) + iVar5 +
             *(int *)((long)aiStack_78 + lVar2 + 0xc) >> auVar40;
        auVar50 = packssdw(auVar28,auVar28);
        *(long *)(*(undefined1 (*) [16])pi2_dst + lVar23) = auVar50._0_8_;
        iVar6 = *(int *)((long)aiStack_78 + lVar22 + 4);
        auVar29._0_4_ = (*(int *)((long)aiStack_b8 + lVar22 + 0xc) + iVar5) - iVar6 >> auVar40;
        auVar29._4_4_ =
             (*(int *)((long)aiStack_b8 + lVar22 + 8) + iVar5) -
             *(int *)((long)aiStack_78 + lVar22 + 8) >> auVar40;
        auVar29._8_4_ = (*(int *)((long)aiStack_b8 + lVar22 + 4) + iVar5) - iVar6 >> auVar40;
        auVar29._12_4_ =
             (*(int *)((long)aiStack_b8 + lVar22) + iVar5) - *(int *)((long)aiStack_78 + lVar22) >>
             auVar40;
        auVar50 = packssdw(auVar29,auVar29);
        *(long *)(*(undefined1 (*) [16])((long)pi2_dst + 0x20) + lVar23) = auVar50._0_8_;
        lVar23 = lVar23 + 8;
        lVar22 = lVar22 + -0x10;
      } while (lVar23 != 0x20);
    }
    else {
      *(undefined1 (*) [16])((long)pi2_dst + 0x30) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pi2_dst + 0x20) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pi2_dst + 0x10) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])pi2_dst = (undefined1  [16])0x0;
    }
    pi2_src = pi2_src + 1;
    pi2_dst = (WORD16 *)(*(undefined1 (*) [16])pi2_dst + (long)dst_strd * 2);
    zero_cols = zero_cols >> 1;
    iVar24 = iVar24 + 1;
  } while (iVar24 != 0x20);
  return;
}

Assistant:

void ihevc_itrans_32x32(WORD16 *pi2_src,
                        WORD16 *pi2_dst,
                        WORD32 src_strd,
                        WORD32 dst_strd,
                        WORD32 i4_shift,
                        WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[16], o[16];
    WORD32 ee[8], eo[8];
    WORD32 eee[4], eeo[4];
    WORD32 eeee[2], eeeo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_32; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_32 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 16; k++)
            {
                o[k] = g_ai2_ihevc_trans_32[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_32[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_32[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_32[7][k]
                                                * pi2_src[7 * src_strd]
                                + g_ai2_ihevc_trans_32[9][k]
                                                * pi2_src[9 * src_strd]
                                + g_ai2_ihevc_trans_32[11][k]
                                                * pi2_src[11 * src_strd]
                                + g_ai2_ihevc_trans_32[13][k]
                                                * pi2_src[13 * src_strd]
                                + g_ai2_ihevc_trans_32[15][k]
                                                * pi2_src[15 * src_strd]
                                + g_ai2_ihevc_trans_32[17][k]
                                                * pi2_src[17 * src_strd]
                                + g_ai2_ihevc_trans_32[19][k]
                                                * pi2_src[19 * src_strd]
                                + g_ai2_ihevc_trans_32[21][k]
                                                * pi2_src[21 * src_strd]
                                + g_ai2_ihevc_trans_32[23][k]
                                                * pi2_src[23 * src_strd]
                                + g_ai2_ihevc_trans_32[25][k]
                                                * pi2_src[25 * src_strd]
                                + g_ai2_ihevc_trans_32[27][k]
                                                * pi2_src[27 * src_strd]
                                + g_ai2_ihevc_trans_32[29][k]
                                                * pi2_src[29 * src_strd]
                                + g_ai2_ihevc_trans_32[31][k]
                                                * pi2_src[31 * src_strd];
            }
            for(k = 0; k < 8; k++)
            {
                eo[k] = g_ai2_ihevc_trans_32[2][k] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_32[6][k]
                                                * pi2_src[6 * src_strd]
                                + g_ai2_ihevc_trans_32[10][k]
                                                * pi2_src[10 * src_strd]
                                + g_ai2_ihevc_trans_32[14][k]
                                                * pi2_src[14 * src_strd]
                                + g_ai2_ihevc_trans_32[18][k]
                                                * pi2_src[18 * src_strd]
                                + g_ai2_ihevc_trans_32[22][k]
                                                * pi2_src[22 * src_strd]
                                + g_ai2_ihevc_trans_32[26][k]
                                                * pi2_src[26 * src_strd]
                                + g_ai2_ihevc_trans_32[30][k]
                                                * pi2_src[30 * src_strd];
            }
            for(k = 0; k < 4; k++)
            {
                eeo[k] = g_ai2_ihevc_trans_32[4][k] * pi2_src[4 * src_strd]
                                + g_ai2_ihevc_trans_32[12][k]
                                                * pi2_src[12 * src_strd]
                                + g_ai2_ihevc_trans_32[20][k]
                                                * pi2_src[20 * src_strd]
                                + g_ai2_ihevc_trans_32[28][k]
                                                * pi2_src[28 * src_strd];
            }
            eeeo[0] = g_ai2_ihevc_trans_32[8][0] * pi2_src[8 * src_strd]
                            + g_ai2_ihevc_trans_32[24][0]
                                            * pi2_src[24 * src_strd];
            eeeo[1] = g_ai2_ihevc_trans_32[8][1] * pi2_src[8 * src_strd]
                            + g_ai2_ihevc_trans_32[24][1]
                                            * pi2_src[24 * src_strd];
            eeee[0] = g_ai2_ihevc_trans_32[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_32[16][0]
                                            * pi2_src[16 * src_strd];
            eeee[1] = g_ai2_ihevc_trans_32[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_32[16][1]
                                            * pi2_src[16 * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            eee[0] = eeee[0] + eeeo[0];
            eee[3] = eeee[0] - eeeo[0];
            eee[1] = eeee[1] + eeeo[1];
            eee[2] = eeee[1] - eeeo[1];
            for(k = 0; k < 4; k++)
            {
                ee[k] = eee[k] + eeo[k];
                ee[k + 4] = eee[3 - k] - eeo[3 - k];
            }
            for(k = 0; k < 8; k++)
            {
                e[k] = ee[k] + eo[k];
                e[k + 8] = ee[7 - k] - eo[7 - k];
            }
            for(k = 0; k < 16; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 16] =
                                CLIP_S16(((e[15 - k] - o[15 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}